

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  undefined8 *puVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Mat3 m;
  float local_c8 [4];
  float local_b8 [4];
  float local_a8 [4];
  float local_98 [2];
  undefined8 local_90;
  undefined4 local_88;
  Matrix<float,_3,_3> local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  Matrix<float,_3,_3> local_2c;
  long lVar8;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_58;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar6 = 0;
      auVar7 = _DAT_019fcc00;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar2 != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar6) = uVar10;
        }
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar2 + -0xc != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar6 + 0xc) = uVar10;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x30);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar4 != 3);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    local_48 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    uStack_50 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    local_38 = evalCtx->in[2].m_data[2];
    uStack_40 = *(undefined8 *)evalCtx->in[2].m_data;
    mat = (Matrix<float,_3,_3> *)0x3;
  }
  else {
    puVar1 = &local_58;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0.0;
    puVar3 = &s_constInMat3x3;
    mat = (Matrix<float,_3,_3> *)0x0;
    do {
      lVar2 = 0;
      puVar5 = puVar1;
      do {
        *(undefined4 *)puVar5 = puVar3[lVar2];
        lVar2 = lVar2 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
      } while (lVar2 != 3);
      mat = (Matrix<float,_3,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (mat != (Matrix<float,_3,_3> *)0x3);
  }
  decrement<float,3,3>(&local_2c,(MatrixCaseUtils *)&local_58,mat);
  local_80.m_data.m_data[0].m_data[2] = 0.0;
  local_80.m_data.m_data[0].m_data[0] = 0.0;
  local_80.m_data.m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    local_80.m_data.m_data[0].m_data[lVar2] =
         local_2c.m_data.m_data[0].m_data[lVar2] + local_2c.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar2 = 0;
  do {
    local_b8[lVar2] =
         local_80.m_data.m_data[0].m_data[lVar2] + local_2c.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  decrement<float,3,3>(&local_80,(MatrixCaseUtils *)&local_58,mat_00);
  local_90 = (ulong)local_90._4_4_ << 0x20;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar2 = 0;
  do {
    local_98[lVar2] =
         local_80.m_data.m_data[0].m_data[lVar2] + local_80.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  lVar2 = 0;
  do {
    local_c8[lVar2] = local_98[lVar2] + local_80.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar2 = 0;
  do {
    local_b8[lVar2 + 4] = local_b8[lVar2] + local_c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_90 = 0x100000000;
  local_88 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_98[lVar2]] = local_b8[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}